

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

ssize_t sf_parse_params(uint8_t *begin,uint8_t *end)

{
  ssize_t sVar1;
  uint8_t *begin_00;
  bool bVar2;
  ssize_t slen;
  uint8_t *p;
  uint8_t *end_local;
  uint8_t *begin_local;
  
  slen = (ssize_t)begin;
  while( true ) {
    bVar2 = false;
    if ((uint8_t *)slen != end) {
      bVar2 = *(char *)slen == ';';
    }
    if (!bVar2) {
      return slen - (long)begin;
    }
    do {
      slen = slen + 1;
      if ((uint8_t *)slen == end) {
        return -1;
      }
    } while (*(char *)slen == ' ');
    sVar1 = sf_parse_key((uint8_t *)slen,end);
    if (sVar1 < 0) break;
    slen = sVar1 + slen;
    if (((uint8_t *)slen != end) && (*(uint8_t *)slen == '=')) {
      begin_00 = (uint8_t *)(slen + 1);
      if (begin_00 == end) {
        return -1;
      }
      sVar1 = sf_parse_bare_item((nghttp2_sf_value *)0x0,begin_00,end);
      if (sVar1 < 0) {
        return -1;
      }
      slen = (ssize_t)(begin_00 + sVar1);
    }
  }
  return -1;
}

Assistant:

static ssize_t sf_parse_params(const uint8_t *begin, const uint8_t *end) {
  const uint8_t *p = begin;
  ssize_t slen;

  for (; p != end && *p == ';';) {
    ++p;

    sf_discard_sp_end_err(p, end, -1);

    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return -1;
    }

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
    } else if (++p == end) {
      return -1;
    } else {
      slen = sf_parse_bare_item(NULL, p, end);
      if (slen < 0) {
        return -1;
      }

      p += slen;
    }
  }

  return p - begin;
}